

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O3

double __thiscall agg::bspline::extrapolation_right(bspline *this,double x)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  lVar5 = (long)this->m_num;
  dVar2 = this->m_x[lVar5 + -1];
  dVar6 = dVar2 - this->m_x[lVar5 + -2];
  dVar3 = this->m_y[lVar5 + -1];
  pdVar1 = this->m_y + lVar5 + -2;
  auVar7._0_8_ = (this->m_am).m_array[lVar5 - 2U & 0xffffffff] * dVar6;
  auVar7._8_8_ = 0;
  auVar8._8_8_ = dVar3 - *pdVar1;
  auVar8._0_8_ = dVar3 - *pdVar1;
  auVar8 = blendpd(auVar7,auVar8,2);
  auVar4._8_8_ = dVar6;
  auVar4._0_8_ = 0x4018000000000000;
  auVar8 = divpd(auVar8,auVar4);
  return (x - dVar2) * (auVar8._0_8_ + auVar8._8_8_) + dVar3;
}

Assistant:

double bspline::extrapolation_right(double x) const
    {
        double d = m_x[m_num - 1] - m_x[m_num - 2];
        return (d * m_am[m_num - 2] / 6 + (m_y[m_num - 1] - m_y[m_num - 2]) / d) * 
               (x - m_x[m_num - 1]) + 
               m_y[m_num - 1];
    }